

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O2

ElementPtr __thiscall
Rml::ElementInstancerElement::InstanceElement
          (ElementInstancerElement *this,Element *param_1,String *tag,XMLAttributes *param_3)

{
  ElementInstancerPools *this_00;
  Element *pEVar1;
  
  this_00 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                      ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                       element_instancer_pools);
  pEVar1 = Pool<Rml::Element>::AllocateAndConstruct<std::__cxx11::string_const&>
                     (&this_00->pool_element,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_3);
  (this->super_ElementInstancer)._vptr_ElementInstancer = (_func_int **)pEVar1;
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr ElementInstancerElement::InstanceElement(Element* /*parent*/, const String& tag, const XMLAttributes& /*attributes*/)
{
	Element* ptr = element_instancer_pools->pool_element.AllocateAndConstruct(tag);
	return ElementPtr(ptr);
}